

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peephole.cpp
# Opt level: O0

Module * mocker::runPeepholeOptimization(Module *__return_storage_ptr__,Module *module)

{
  Module *module_local;
  Module *res;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  anon_unknown_2::useIncDec(__return_storage_ptr__);
  anon_unknown_2::removeUnusedValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

nasm::Module runPeepholeOptimization(const nasm::Module &module) {
  auto res = module;
  useIncDec(res);
  removeUnusedValue(res);
  return res;
}